

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O2

DataPointer *
duckdb::DataPointer::Deserialize(DataPointer *__return_storage_ptr__,Deserializer *deserializer)

{
  CompressionType type;
  unsigned_long uVar1;
  unsigned_long uVar2;
  BlockPointer BVar3;
  BaseStatistics local_e0;
  BaseStatistics statistics;
  
  uVar1 = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,100,"row_start");
  uVar2 = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0x65,"tuple_count");
  BVar3 = Deserializer::ReadProperty<duckdb::BlockPointer>(deserializer,0x66,"block_pointer");
  type = Deserializer::ReadProperty<duckdb::CompressionType>(deserializer,0x67,"compression_type");
  Deserializer::ReadProperty<duckdb::BaseStatistics>(&statistics,deserializer,0x68,"statistics");
  BaseStatistics::BaseStatistics(&local_e0,&statistics);
  DataPointer(__return_storage_ptr__,&local_e0);
  BaseStatistics::~BaseStatistics(&local_e0);
  __return_storage_ptr__->row_start = uVar1;
  __return_storage_ptr__->tuple_count = uVar2;
  __return_storage_ptr__->block_pointer = BVar3;
  __return_storage_ptr__->compression_type = type;
  SerializationData::Set<duckdb::CompressionType>(&deserializer->data,type);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ColumnSegmentState,std::default_delete<duckdb::ColumnSegmentState>,true>>
            (deserializer,0x69,"segment_state",&__return_storage_ptr__->segment_state);
  SerializationData::Unset<duckdb::CompressionType>(&deserializer->data);
  BaseStatistics::~BaseStatistics(&statistics);
  return __return_storage_ptr__;
}

Assistant:

DataPointer DataPointer::Deserialize(Deserializer &deserializer) {
	auto row_start = deserializer.ReadPropertyWithDefault<uint64_t>(100, "row_start");
	auto tuple_count = deserializer.ReadPropertyWithDefault<uint64_t>(101, "tuple_count");
	auto block_pointer = deserializer.ReadProperty<BlockPointer>(102, "block_pointer");
	auto compression_type = deserializer.ReadProperty<CompressionType>(103, "compression_type");
	auto statistics = deserializer.ReadProperty<BaseStatistics>(104, "statistics");
	DataPointer result(std::move(statistics));
	result.row_start = row_start;
	result.tuple_count = tuple_count;
	result.block_pointer = block_pointer;
	result.compression_type = compression_type;
	deserializer.Set<CompressionType>(compression_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ColumnSegmentState>>(105, "segment_state", result.segment_state);
	deserializer.Unset<CompressionType>();
	return result;
}